

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

JavascriptString * Js::JavascriptConversion::ToLocaleString(Var aValue,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ThreadContext *this;
  code *pcVar3;
  double value;
  bool bVar4;
  bool bVar5;
  int32 iVar6;
  BOOL BVar7;
  Attributes attributes;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  RecyclableObject *pRVar10;
  Var aValue_00;
  JavascriptTypedNumber<long> *pJVar11;
  JavascriptTypedNumber<unsigned_long> *pJVar12;
  JavascriptSymbol *this_00;
  JavascriptBoolean *pJVar13;
  PropertyRecord *pPVar14;
  Type *this_01;
  anon_class_24_3_3aface9f local_48;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_009847be;
    *puVar8 = 0;
  }
  bVar4 = TaggedInt::Is(aValue);
  if (bVar4) {
switchD_0098459c_caseD_3:
    iVar6 = TaggedInt::ToInt32(aValue);
    value = (double)iVar6;
    goto LAB_009844a5;
  }
  if ((ulong)aValue >> 0x32 == 0) {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_009847be;
      *puVar8 = 0;
    }
    TVar2 = ((pRVar10->type).ptr)->typeId;
    if ((0x57 < (int)TVar2) && (BVar7 = RecyclableObject::IsExternal(pRVar10), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_009847be:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    switch(TVar2) {
    case TypeIds_Undefined:
      pJVar9 = StringCache::GetUndefinedDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
      return pJVar9;
    case TypeIds_Null:
      pJVar9 = StringCache::GetNullDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
      return pJVar9;
    case TypeIds_Boolean:
      pJVar13 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
      this_01 = &((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache;
      if (pJVar13->value != 0) {
        pJVar9 = StringCache::GetTrueDisplay(this_01);
        return pJVar9;
      }
      pJVar9 = StringCache::GetFalseDisplay(this_01);
      return pJVar9;
    case TypeIds_FirstNumberType:
      goto switchD_0098459c_caseD_3;
    case TypeIds_Number:
      goto switchD_0098459c_caseD_4;
    case TypeIds_Int64Number:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      value = (double)pJVar11->m_value;
      break;
    case TypeIds_LastNumberType:
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      value = ((double)CONCAT44(0x43300000,(int)pJVar12->m_value) - 4503599627370496.0) +
              ((double)CONCAT44(0x45300000,(int)(pJVar12->m_value >> 0x20)) - 1.9342813113834067e+25
              );
      break;
    default:
      pRVar10 = VarTo<Js::RecyclableObject>(aValue);
      aValue_00 = JavascriptOperators::GetProperty
                            (pRVar10,0x172,scriptContext,(PropertyValueInfo *)0x0);
      bVar4 = IsCallable(aValue_00);
      if (!bVar4) {
        pPVar14 = ScriptContext::GetPropertyName(scriptContext,0x172);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar14 + 1));
      }
      pRVar10 = VarTo<Js::RecyclableObject>(aValue_00);
      this = scriptContext->threadContext;
      bVar4 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      local_48.scriptContext = scriptContext;
      local_48.toLocaleStringFunction = pRVar10;
      local_48.aValue = aValue;
      attributes = FunctionInfo::GetAttributes(pRVar10);
      bVar5 = ThreadContext::HasNoSideEffect(this,pRVar10,attributes);
      if (bVar5) {
        pRVar10 = (RecyclableObject *)
                  ToLocaleString::anon_class_24_3_3aface9f::operator()(&local_48);
        bVar5 = ThreadContext::IsOnStack(pRVar10);
      }
      else {
        if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
          this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
          pRVar10 = (((((((((pRVar10->type).ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                     javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
          goto LAB_00984766;
        }
        if ((attributes & HasNoSideEffect) == None) {
          IVar1 = this->implicitCallFlags;
          pRVar10 = (RecyclableObject *)
                    ToLocaleString::anon_class_24_3_3aface9f::operator()(&local_48);
          this->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
          goto LAB_00984766;
        }
        pRVar10 = (RecyclableObject *)
                  ToLocaleString::anon_class_24_3_3aface9f::operator()(&local_48);
        bVar5 = ThreadContext::IsOnStack(pRVar10);
      }
      if (bVar5 != false) {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
      }
LAB_00984766:
      this->reentrancySafeOrHandled = bVar4;
      bVar4 = VarIs<Js::JavascriptString>(pRVar10);
      if (bVar4) {
        pJVar9 = UnsafeVarTo<Js::JavascriptString>(pRVar10);
        return pJVar9;
      }
      pJVar9 = ToString(pRVar10,scriptContext);
      return pJVar9;
    case TypeIds_Symbol:
      this_00 = UnsafeVarTo<Js::JavascriptSymbol>(aValue);
      pJVar9 = JavascriptSymbol::ToString(this_00,scriptContext);
      return pJVar9;
    }
  }
  else {
switchD_0098459c_caseD_4:
    value = JavascriptNumber::GetValue(aValue);
  }
LAB_009844a5:
  pJVar9 = JavascriptNumber::ToLocaleString(value,scriptContext);
  return pJVar9;
}

Assistant:

JavascriptString *JavascriptConversion::ToLocaleString(Var aValue, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();

        case TypeIds_Null:
            return scriptContext->GetLibrary()->GetNullDisplayString();

        case TypeIds_Integer:
            return JavascriptNumber::ToLocaleString(TaggedInt::ToInt32(aValue), scriptContext);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? scriptContext->GetLibrary()->GetTrueDisplayString() : scriptContext->GetLibrary()->GetFalseDisplayString();

        case TypeIds_Int64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_UInt64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_Number:
            return JavascriptNumber::ToLocaleString(JavascriptNumber::GetValue(aValue), scriptContext);

        case TypeIds_Symbol:
            return UnsafeVarTo<JavascriptSymbol>(aValue)->ToString(scriptContext);

        default:
            {
                RecyclableObject* object = VarTo<RecyclableObject>(aValue);
                Var value = JavascriptOperators::GetProperty(object, PropertyIds::toLocaleString, scriptContext, NULL);

                if (JavascriptConversion::IsCallable(value))
                {
                    RecyclableObject* toLocaleStringFunction = VarTo<RecyclableObject>(value);
                    Var aResult = scriptContext->GetThreadContext()->ExecuteImplicitCall(toLocaleStringFunction, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), toLocaleStringFunction, CallInfo(1), aValue);
                    });
                    if (VarIs<JavascriptString>(aResult))
                    {
                        return UnsafeVarTo<JavascriptString>(aResult);
                    }
                    else
                    {
                        return JavascriptConversion::ToString(aResult, scriptContext);
                    }
                }

                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toLocaleString)->GetBuffer());
            }
        }
    }